

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_deconstruction.h
# Opt level: O2

QuaternionData
ximu::PacketDeconstruction::
deconstructQuaternionData<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  QuaternionData QVar4;
  
  QVar4._w = FixedFloat::toFloat(begin._M_current[1],begin._M_current[2],ALGORITHM_KI);
  fVar1 = FixedFloat::toFloat(begin._M_current[3],begin._M_current[4],ALGORITHM_KI);
  fVar2 = FixedFloat::toFloat(begin._M_current[5],begin._M_current[6],ALGORITHM_KI);
  fVar3 = FixedFloat::toFloat(begin._M_current[7],begin._M_current[8],ALGORITHM_KI);
  QVar4._z = fVar3;
  QVar4._y = fVar2;
  QVar4._x = fVar1;
  return QVar4;
}

Assistant:

static QuaternionData deconstructQuaternionData(InputIterator begin, InputIterator end) {
    return
    QuaternionData (
      FixedFloat::toFloat(begin[1], begin[2], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[3], begin[4], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[5], begin[6], Qvals::QUATERNION),
      FixedFloat::toFloat(begin[7], begin[8], Qvals::QUATERNION));
  }